

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_utils.h
# Opt level: O1

vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
* Gudhi::read_lower_triangular_matrix_from_csv_file<float>
            (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *__return_storage_ptr__,string *filename,char separator)

{
  char cVar1;
  istream *piVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  string line;
  vector<float,_std::allocator<float>_> values_in_this_line_1;
  double entry;
  vector<float,_std::allocator<float>_> values_in_this_line;
  istringstream iss;
  ifstream in;
  undefined1 *local_428;
  long local_420;
  undefined1 local_418;
  undefined7 uStack_417;
  vector<float,_std::allocator<float>_> local_408;
  float local_3e4;
  double local_3e0;
  value_type local_3d8;
  long local_3b8 [4];
  int aiStack_398 [22];
  ios_base local_340 [264];
  long local_238 [65];
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(local_238);
  std::ifstream::open((char *)local_238,(_Ios_Openmode)(filename->_M_dataplus)._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    local_428 = &local_418;
    local_420 = 0;
    local_418 = 0;
    cVar1 = std::ios::widen((char)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_428,cVar1);
    local_3d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_3d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_3d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::push_back(__return_storage_ptr__,&local_3d8);
    uVar5 = 0;
    while( true ) {
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_428,cVar1);
      if ((((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) || (local_420 == 0))
      break;
      if (local_428[local_420 + -1] == separator) {
        std::__cxx11::string::pop_back();
      }
      if (local_420 != 0) {
        lVar3 = 0;
        do {
          if (local_428[lVar3] == separator) {
            local_428[lVar3] = 0x20;
          }
          lVar3 = lVar3 + 1;
        } while (local_420 != lVar3);
      }
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_3b8,(string *)&local_428,_S_in);
      local_408.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (float *)0x0;
      local_408.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (float *)0x0;
      local_408.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (float *)0x0;
      if (*(int *)((long)aiStack_398 + *(long *)(local_3b8[0] + -0x18)) == 0) {
        uVar4 = 0;
        do {
          std::istream::_M_extract<double>((double *)local_3b8);
          if (uVar4 <= uVar5) {
            local_3e4 = (float)local_3e0;
            if (local_408.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_408.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                        (&local_408,
                         (iterator)
                         local_408.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_3e4);
            }
            else {
              *local_408.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish = (float)local_3e0;
              local_408.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_408.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          uVar4 = uVar4 + 1;
        } while (*(int *)((long)aiStack_398 + *(long *)(local_3b8[0] + -0x18)) == 0);
      }
      if (local_408.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_408.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::push_back(__return_storage_ptr__,&local_408);
      }
      if (local_408.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (float *)0x0) {
        operator_delete(local_408.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_408.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_408.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar5 = uVar5 + 1;
      std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
      std::ios_base::~ios_base(local_340);
    }
    std::ifstream::close();
    if (local_3d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_3d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_3d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_3d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_428 != &local_418) {
      operator_delete(local_428,CONCAT71(uStack_417,local_418) + 1);
    }
  }
  std::ifstream::~ifstream(local_238);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<Filtration_value>> read_lower_triangular_matrix_from_csv_file(const std::string& filename,
                                                                                      const char separator = ';') {
#ifdef DEBUG_TRACES
  std::clog << "Using procedure read_lower_triangular_matrix_from_csv_file \n";
#endif  // DEBUG_TRACES
  std::vector<std::vector<Filtration_value>> result;
  std::ifstream in;
  in.open(filename.c_str());
  if (!in.is_open()) {
    return result;
  }

  std::string line;

  // the first line is empty, so we ignore it:
  std::getline(in, line);
  std::vector<Filtration_value> values_in_this_line;
  result.push_back(values_in_this_line);

  int number_of_line = 0;

  // first, read the file line by line to a string:
  while (std::getline(in, line)) {
    // if line is empty, break
    if (line.size() == 0) break;

    // if the last element of a string is comma:
    if (line[line.size() - 1] == separator) {
      // then shrink the string by one
      line.pop_back();
    }

    // replace all commas with spaces
    std::replace(line.begin(), line.end(), separator, ' ');

    // put the new line to a stream
    std::istringstream iss(line);
    // and now read the doubles.

    int number_of_entry = 0;
    std::vector<Filtration_value> values_in_this_line;
    while (iss.good()) {
      double entry;
      iss >> entry;
      if (number_of_entry <= number_of_line) {
        values_in_this_line.push_back(entry);
      }
      ++number_of_entry;
    }
    if (!values_in_this_line.empty()) result.push_back(values_in_this_line);
    ++number_of_line;
  }
  in.close();

#ifdef DEBUG_TRACES
  std::clog << "Here is the matrix we read : \n";
  for (size_t i = 0; i != result.size(); ++i) {
    for (size_t j = 0; j != result[i].size(); ++j) {
      std::clog << result[i][j] << " ";
    }
    std::clog << std::endl;
  }
#endif  // DEBUG_TRACES

  return result;
}